

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O0

long gimage::cmp<float>(Image<float,_gimage::PixelTraits<float>_> *diff,
                       Image<float,_gimage::PixelTraits<float>_> *im1,
                       Image<float,_gimage::PixelTraits<float>_> *im2,
                       vector<float,_std::allocator<float>_> *tol)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  size_type sVar6;
  const_reference pvVar7;
  long lVar8;
  vector<float,_std::allocator<float>_> *in_RCX;
  Image<float,_gimage::PixelTraits<float>_> *in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  work_t wVar9;
  work_t wVar10;
  work_t v;
  work_t v2;
  work_t v1;
  long i;
  long k;
  int d;
  work_t t;
  long ret;
  work_t in_stack_ffffffffffffff58;
  work_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  float fVar11;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  long in_stack_ffffffffffffffb8;
  Image<float,_gimage::PixelTraits<float>_> *this;
  Image<float,_gimage::PixelTraits<float>_> *i_00;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffffc0;
  int local_38;
  float local_34;
  long local_30;
  
  lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
  lVar5 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDX);
  if (lVar4 == lVar5) {
    lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
    lVar5 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDX);
    if (lVar4 == lVar5) {
      iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RSI);
      iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RDX);
      if (iVar2 == iVar3) {
        Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
        Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
        Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RSI);
        Image<float,_gimage::PixelTraits<float>_>::setSize
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        local_30 = 0;
        local_34 = 0.0;
        local_38 = 0;
        while (iVar2 = local_38, iVar3 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RSI)
              , iVar2 < iVar3) {
          iVar3 = local_38;
          sVar6 = std::vector<float,_std::allocator<float>_>::size(in_RCX);
          if (iVar3 < (int)sVar6) {
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](in_RCX,(long)local_38);
            local_34 = *pvVar7;
          }
          lVar4 = 0;
          while (lVar5 = lVar4, lVar8 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI)
                , lVar4 < lVar8) {
            this = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
            while (i_00 = this, lVar8 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI),
                  (long)this < lVar8) {
              wVar9 = Image<float,_gimage::PixelTraits<float>_>::getW
                                (in_RSI,(long)i_00,lVar5,local_38);
              wVar10 = Image<float,_gimage::PixelTraits<float>_>::getW
                                 (in_RDX,(long)i_00,lVar5,local_38);
              bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidW
                                (this,in_stack_ffffffffffffff5c);
              if ((bVar1) &&
                 (bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidW
                                    (this,in_stack_ffffffffffffff5c), bVar1)) {
                fVar11 = wVar9 - wVar10;
              }
              else {
                bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidW
                                  (this,in_stack_ffffffffffffff5c);
                if ((bVar1) ||
                   (bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidW
                                      (this,in_stack_ffffffffffffff5c), bVar1)) {
                  fVar11 = PixelTraits<float>::invalid();
                }
                else {
                  fVar11 = 0.0;
                }
              }
              if (local_34 < fVar11) {
                local_30 = local_30 + 1;
              }
              Image<float,_gimage::PixelTraits<float>_>::setLimited
                        ((Image<float,_gimage::PixelTraits<float>_> *)CONCAT44(iVar2,iVar3),lVar4,
                         (long)this,(int)in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
              this = (Image<float,_gimage::PixelTraits<float>_> *)((long)&i_00->depth + 1);
            }
            lVar4 = lVar5 + 1;
          }
          local_38 = local_38 + 1;
        }
        return local_30;
      }
    }
  }
  return -1;
}

Assistant:

long cmp(Image<T> &diff, const Image<T> &im1,
                           const Image<T> &im2, const std::vector<T> &tol)
{
  if (im1.getWidth() != im2.getWidth() || im1.getHeight() != im2.getHeight() ||
      im1.getDepth() != im2.getDepth())
  {
    return -1;
  }

  diff.setSize(im1.getWidth(), im1.getHeight(), im1.getDepth());

  long ret=0;
  typename Image<T>::work_t t=0;

  for (int d=0; d<im1.getDepth(); d++)
  {
    if (d < static_cast<int>(tol.size()))
    {
      t=tol[d];
    }

    for (long k=0; k<im1.getHeight(); k++)
    {
      for (long i=0; i<im1.getWidth(); i++)
      {
        typename Image<T>::work_t v1=im1.getW(i, k, d);
        typename Image<T>::work_t v2=im2.getW(i, k, d);
        typename Image<T>::work_t v;

        if (im1.isValidW(v1) && im2.isValidW(v2))
        {
          v=v1-v2;
        }
        else if (!im1.isValidW(v1) && !im2.isValidW(v2))
        {
          v=0;
        }
        else
        {
          v=Image<T>::ptraits::invalid();
        }

//        if (v < 0)
//        {
//          v=-v;
//        }

        if (v > t)
        {
          ret++;
        }

        diff.setLimited(i, k, d, v);
      }
    }
  }

  return ret;
}